

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateOptional(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  TypeCase TVar2;
  ModelDescription *pMVar3;
  Result local_c8;
  Result local_a0;
  undefined4 local_78;
  Result local_68;
  undefined1 local_40 [8];
  Result r;
  Model *format_local;
  
  r.m_message.field_2._8_8_ = format;
  Result::Result((Result *)local_40);
  validateDefaultOptionalValues(&local_68,(Model *)r.m_message.field_2._8_8_);
  Result::operator=((Result *)local_40,&local_68);
  Result::~Result(&local_68);
  bVar1 = Result::good((Result *)local_40);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
    goto LAB_00431d1f;
  }
  TVar2 = Specification::Model::Type_case((Model *)r.m_message.field_2._8_8_);
  if ((2 < TVar2 - kPipelineClassifier) && (TVar2 != kTreeEnsembleRegressor)) {
    if (TVar2 == kNeuralNetworkRegressor) {
LAB_00431c2b:
      pMVar3 = Specification::Model::description((Model *)r.m_message.field_2._8_8_);
      validateOptionalNN(&local_a0,pMVar3);
      Result::operator=((Result *)local_40,&local_a0);
      Result::~Result(&local_a0);
    }
    else if (TVar2 != kTreeEnsembleClassifier) {
      if ((TVar2 == kNeuralNetworkClassifier) || (TVar2 == kNeuralNetwork)) goto LAB_00431c2b;
      if (TVar2 != kItemSimilarityRecommender) {
        if (TVar2 == kMlProgram) goto LAB_00431c2b;
        if ((TVar2 != kImputer) && (TVar2 != kIdentity)) {
          if (TVar2 == kSerializedModel) goto LAB_00431c2b;
          pMVar3 = Specification::Model::description((Model *)r.m_message.field_2._8_8_);
          validateOptionalGeneric(&local_c8,pMVar3);
          Result::operator=((Result *)local_40,&local_c8);
          Result::~Result(&local_c8);
        }
      }
    }
  }
  bVar1 = Result::good((Result *)local_40);
  if (bVar1) {
    pMVar3 = Specification::Model::description((Model *)r.m_message.field_2._8_8_);
    validateOptionalOutputs(__return_storage_ptr__,pMVar3);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_40);
  }
LAB_00431d1f:
  local_78 = 1;
  Result::~Result((Result *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result validateOptional(const Specification::Model& format) {
        Result r;
        r = validateDefaultOptionalValues(format);

        if (!r.good()) {
            return r;
        }

        switch (format.Type_case()) {
            case Specification::Model::kImputer:
                // Imputed values can be handled by replacing a particular value, so
                // optional is not required.
                break;
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kSerializedModel:
            case Specification::Model::kMlProgram:
                r = validateOptionalNN(format.description());
                break;
            case Specification::Model::kTreeEnsembleRegressor:
            case Specification::Model::kTreeEnsembleClassifier:
                // allow arbitrary optional in tree inputs, just check outputs
                break;
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                // pipeline has valid optional inputs iff the models inside are valid.
                // this should be guaranteed by the pipeline validator.
                break;
            case Specification::Model::kItemSimilarityRecommender:
                // allow arbitrary optional in the recommender.  The recommender valiadator catches these.
                break;
            case Specification::Model::kIdentity:
                // anything goes for the identity function
                break;
            default:
                r = validateOptionalGeneric(format.description());
        }
        if (!r.good()) {
            return r;
        }

        return validateOptionalOutputs(format.description());
    }